

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O2

bool __thiscall
JsUtil::BackgroundJobProcessor::AreAllThreadsWaitingForJobs(BackgroundJobProcessor *this)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  bVar3 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x576,"(criticalSection.IsLocked())","criticalSection.IsLocked()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (this->threadCount == uVar5) break;
    uVar2 = uVar5 + 1;
  } while (this->parallelThreadData[uVar5]->isWaitingForJobs != false);
  return this->threadCount == uVar5;
}

Assistant:

bool BackgroundJobProcessor::AreAllThreadsWaitingForJobs()
    {
        Assert(criticalSection.IsLocked());

        bool isAnyThreadNotWaitingForJobs = false;

        this->IterateBackgroundThreads([&](ParallelThreadData *parallelThreadData)
        {
            if (parallelThreadData->isWaitingForJobs)
            {
                return false;
            }
            // At least one thread was not waiting for jobs.
            isAnyThreadNotWaitingForJobs = true;
            return true;
        });

        return !isAnyThreadNotWaitingForJobs;
    }